

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O0

void test_read_append_filter(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *_a;
  char *pcVar3;
  int r;
  archive *a;
  archive_entry *ae;
  
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'\x85',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_set_format(_a,0x30000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'\x86',(uint)(iVar1 == 0),"0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR)"
                   ,_a);
  iVar1 = archive_read_append_filter(_a,1);
  if (((iVar1 != 0) && (pcVar3 = archive_zlib_version(), pcVar3 == (char *)0x0)) &&
     (wVar2 = canGzip(), wVar2 == L'\0')) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'\x89');
    test_skipping("gzip tests require zlib or working gzip command");
    iVar1 = archive_read_free(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                        ,L'\x8a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    return;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\x8d',0,"ARCHIVE_OK",(long)iVar1,"r",_a);
  iVar1 = archive_read_open_memory(_a,archive,0x5d);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\x8f',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_open_memory(a, archive, sizeof(archive))",(void *)0x0);
  iVar1 = archive_read_next_header(_a,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\x90',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  iVar1 = archive_file_count(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\x91',1,"1",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_filter_code(_a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\x92',(long)iVar1,"archive_filter_code(a, 0)",1,"ARCHIVE_COMPRESSION_GZIP",
                      (void *)0x0);
  iVar1 = archive_format(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\x93',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                      (void *)0x0);
  iVar1 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\x94',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_set_format.c"
                      ,L'\x95',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_append_filter)
{
  struct archive_entry *ae;
  struct archive *a;
  int r;

  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR));
  r = archive_read_append_filter(a, ARCHIVE_FILTER_GZIP);
  if (r != ARCHIVE_OK && archive_zlib_version() == NULL && !canGzip()) {
    skipping("gzip tests require zlib or working gzip command");
    assertEqualInt(ARCHIVE_OK, archive_read_free(a));
    return;
  }
  assertEqualIntA(a, ARCHIVE_OK, r);
  assertEqualInt(ARCHIVE_OK,
      archive_read_open_memory(a, archive, sizeof(archive)));
  assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &ae));
  assertEqualInt(1, archive_file_count(a));
  assertEqualInt(archive_filter_code(a, 0), ARCHIVE_COMPRESSION_GZIP);
  assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);
  assertEqualInt(ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK,archive_read_free(a));
}